

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileGenerator *pFVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  ulong uVar6;
  ZeroCopyOutputStream *pZVar7;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AnnotationCollector *annotation_collector_00;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  FileGenerator *unaff_R14;
  FileDescriptor *pFVar11;
  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
  file_generators;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  Options file_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  string info_full_path;
  string java_filename;
  string package_dir;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  GeneratedCodeInfo annotations;
  FileGenerator **local_258;
  iterator iStack_250;
  FileGenerator **local_248;
  FileDescriptor *local_238;
  GeneratorContext *local_230;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  value_type local_190;
  value_type local_170;
  string local_150;
  string local_130;
  AnnotationCollector local_110;
  GeneratedCodeInfo *local_108;
  Printer local_100;
  GeneratedCodeInfo local_60;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_228.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = file;
  local_230 = context;
  ParseGeneratorParameter(parameter,&local_228);
  local_208._M_p = (pointer)&local_1f8;
  local_210[4] = false;
  local_210[0] = false;
  local_210[1] = false;
  local_210[2] = false;
  local_210[3] = false;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  if (local_228.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_228.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    unaff_R14 = (FileGenerator *)0x0;
    uVar8 = 0;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_228.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + (long)unaff_R14));
      if (iVar4 == 0) {
        psVar5 = (string *)&local_1e8;
LAB_0024c40e:
        std::__cxx11::string::_M_assign(psVar5);
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((long)&((local_228.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           _M_dataplus._M_p + (long)unaff_R14));
        if (iVar4 == 0) {
          local_210[0] = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((long)&((local_228.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + (long)unaff_R14));
          if (iVar4 == 0) {
            local_210[1] = true;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((long)&((local_228.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _M_dataplus._M_p + (long)unaff_R14));
            if (iVar4 == 0) {
              local_210[2] = true;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)((long)&((local_228.
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                 ._M_dataplus._M_p + (long)unaff_R14));
              if (iVar4 == 0) {
                local_210[3] = true;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)((long)&((local_228.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                  ._M_dataplus._M_p + (long)unaff_R14));
                if (iVar4 != 0) {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)((long)&((local_228.
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                  ._M_dataplus._M_p + (long)unaff_R14));
                  if (iVar4 == 0) {
                    psVar5 = (string *)&local_208;
                    goto LAB_0024c40e;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_100,"Unknown generator option: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&unaff_R14->file_ +
                                    (long)local_228.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
                  std::__cxx11::string::operator=((string *)error,(string *)&local_100);
                  if (local_100._0_8_ != (long)&local_100 + 0x10U) {
                    operator_delete((void *)local_100._0_8_);
                  }
                  bVar10 = 0;
                  goto LAB_0024ca90;
                }
                local_210[4] = true;
              }
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
      unaff_R14 = (FileGenerator *)((unaff_R14->classname_).field_2._M_local_buf + 8);
    } while (uVar8 < (ulong)((long)local_228.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_228.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  bVar3 = (bool)local_210[3];
  if (((bool)local_210[3] == true) && ((bool)local_210[1] == true)) {
    bVar10 = 0;
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x3e973b);
  }
  else {
    if (((bool)local_210[0] == false) &&
       (((bool)local_210[1] == false && ((bool)local_210[2] == false)))) {
      local_210[0] = true;
      local_210[2] = true;
      local_210._0_4_ = CONCAT13(bVar3,local_210._0_3_);
    }
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248 = (FileGenerator **)0x0;
    local_258 = (FileGenerator **)0x0;
    iStack_250._M_current = (FileGenerator **)0x0;
    if ((bool)local_210[0] == true) {
      unaff_R14 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(unaff_R14,local_238,(Options *)local_210,true);
      local_100._0_8_ = unaff_R14;
      if (iStack_250._M_current == local_248) {
        std::
        vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::java::FileGenerator*>
                  ((vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
                    *)&local_258,iStack_250,(FileGenerator **)&local_100);
      }
      else {
        *iStack_250._M_current = unaff_R14;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
    }
    if ((bool)local_210[1] == true) {
      unaff_R14 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(unaff_R14,local_238,(Options *)local_210,false);
      local_100._0_8_ = unaff_R14;
      if (iStack_250._M_current == local_248) {
        std::
        vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::java::FileGenerator*>
                  ((vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
                    *)&local_258,iStack_250,(FileGenerator **)&local_100);
      }
      else {
        *iStack_250._M_current = unaff_R14;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
    }
    pFVar11 = (FileDescriptor *)
              CONCAT71((int7)((ulong)unaff_R14 >> 8),iStack_250._M_current == local_258);
    if (iStack_250._M_current != local_258) {
      uVar8 = 0;
      do {
        bVar3 = FileGenerator::Validate(local_258[uVar8],error);
        if (!bVar3) {
          if (iStack_250._M_current != local_258) {
            uVar8 = 0;
            do {
              pFVar1 = local_258[uVar8];
              if (pFVar1 != (FileGenerator *)0x0) {
                FileGenerator::~FileGenerator(pFVar1);
                operator_delete(pFVar1);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ulong)((long)iStack_250._M_current - (long)local_258 >> 3));
          }
          goto LAB_0024ca68;
        }
        uVar8 = uVar8 + 1;
        uVar6 = (long)iStack_250._M_current - (long)local_258 >> 3;
        pFVar11 = (FileDescriptor *)CONCAT71((int7)((ulong)pFVar11 >> 8),uVar6 <= uVar8);
      } while (uVar8 < uVar6);
    }
    local_238 = pFVar11;
    if (iStack_250._M_current != local_258) {
      uVar8 = 0;
      do {
        pFVar1 = local_258[uVar8];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        pcVar2 = (pFVar1->java_package_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar2,pcVar2 + (pFVar1->java_package_)._M_string_length);
        JavaPackageToDir(&local_150,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        std::__cxx11::string::_M_append
                  ((char *)&local_170,(ulong)(pFVar1->classname_)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_170);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_1a8,&local_170);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_170._M_dataplus._M_p,
                   local_170._M_dataplus._M_p + local_170._M_string_length);
        std::__cxx11::string::append((char *)&local_190);
        if (local_210[4] == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1c8,&local_190);
        }
        iVar4 = (*local_230->_vptr_GeneratorContext[2])();
        pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
        GeneratedCodeInfo::GeneratedCodeInfo(&local_60,(Arena *)0x0,false);
        local_110._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004dc430;
        annotation_collector_00 = (AnnotationCollector *)0x0;
        if (local_210[4] != false) {
          annotation_collector_00 = &local_110;
        }
        local_108 = &local_60;
        io::Printer::Printer(&local_100,pZVar7,'$',annotation_collector_00);
        FileGenerator::Generate(pFVar1,&local_100);
        FileGenerator::GenerateSiblings(pFVar1,&local_150,local_230,&local_1a8,&local_1c8);
        if (local_210[4] == true) {
          iVar4 = (*local_230->_vptr_GeneratorContext[2])(local_230,&local_190);
          output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_60,output);
          if (output != (ZeroCopyOutputStream *)0x0) {
            (*output->_vptr_ZeroCopyOutputStream[1])(output);
          }
        }
        io::Printer::~Printer(&local_100);
        GeneratedCodeInfo::~GeneratedCodeInfo(&local_60);
        if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)iStack_250._M_current - (long)local_258 >> 3));
    }
    if (iStack_250._M_current != local_258) {
      uVar8 = 0;
      do {
        pFVar1 = local_258[uVar8];
        if (pFVar1 != (FileGenerator *)0x0) {
          FileGenerator::~FileGenerator(pFVar1);
          operator_delete(pFVar1);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)iStack_250._M_current - (long)local_258 >> 3));
    }
    if (iStack_250._M_current != local_258) {
      iStack_250._M_current = local_258;
    }
    if (local_1e0 != 0) {
      iVar4 = (*local_230->_vptr_GeneratorContext[2])(local_230,&local_1e8);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar4);
      io::Printer::Printer(&local_100,pZVar7,'$');
      if (local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar9 = 0;
        uVar8 = 0;
        do {
          io::Printer::Print<char[9],std::__cxx11::string>
                    (&local_100,"$filename$\n",(char (*) [9])"filename",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_1a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ));
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar8 < (ulong)((long)local_1a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      io::Printer::~Printer(&local_100);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
    pFVar11 = local_238;
    if (local_200 != 0) {
      iVar4 = (*local_230->_vptr_GeneratorContext[2])(local_230,&local_208);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar4);
      io::Printer::Printer(&local_100,pZVar7,'$');
      if (local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar9 = 0;
        uVar8 = 0;
        do {
          io::Printer::Print<char[9],std::__cxx11::string>
                    (&local_100,"$filename$\n",(char (*) [9])"filename",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_1c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ));
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar8 < (ulong)((long)local_1c8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1c8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      io::Printer::~Printer(&local_100);
      pFVar11 = local_238;
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
        pFVar11 = local_238;
      }
    }
LAB_0024ca68:
    bVar10 = (byte)pFVar11;
    if (local_258 != (FileGenerator **)0x0) {
      operator_delete(local_258);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
  }
LAB_0024ca90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_228);
  return (bool)(bVar10 & 1);
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "output_list_file") {
      file_options.output_list_file = options[i].second;
    } else if (options[i].first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (options[i].first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (options[i].first == "shared") {
      file_options.generate_shared_code = true;
    } else if (options[i].first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (options[i].first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (options[i].first == "annotation_list_file") {
      file_options.annotation_list_file = options[i].second;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<FileGenerator*> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.push_back(new FileGenerator(file, file_options,
                                                /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.push_back(new FileGenerator(file, file_options,
                                                /* mutable = */ false));
  }

  for (int i = 0; i < file_generators.size(); ++i) {
    if (!file_generators[i]->Validate(error)) {
      for (int j = 0; j < file_generators.size(); ++j) {
        delete file_generators[j];
      }
      return false;
    }
  }

  for (int i = 0; i < file_generators.size(); ++i) {
    FileGenerator* file_generator = file_generators[i];

    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename = package_dir;
    java_filename += file_generator->classname();
    java_filename += ".java";
    all_files.push_back(java_filename);
    std::string info_full_path = java_filename + ".pb.meta";
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : NULL);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  for (int i = 0; i < file_generators.size(); ++i) {
    delete file_generators[i];
  }
  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}